

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void plain_array_suite::expand_front(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  reference piVar2;
  ulong uVar3;
  ulong uVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_e1;
  vector<int,_std::allocator<int>_> local_e0;
  circular_view<int,_18446744073709551615UL> local_c8;
  int local_a8 [4];
  circular_view<int,_18446744073709551615UL> *local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  type local_38 [4];
  
  local_c8.member.data = local_38;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_c8.member.cap = 4;
  local_c8.member.size = 0;
  local_c8.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_c8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_c8);
  *piVar2 = 0xb;
  local_a8[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l,&local_e1);
  uVar1 = local_c8.member.cap * 2;
  uVar3 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar4 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_40 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_40 = local_c8.member.next % uVar1;
  }
  first_end.current = sStack_40;
  first_end.parent = &local_c8;
  first_begin.current = uVar4;
  first_begin.parent = &local_c8;
  local_48 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x62f,"void plain_array_suite::expand_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_c8,1);
  local_a8[0] = 0;
  local_a8[1] = 0xb;
  __l_00._M_len = 2;
  __l_00._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_00,&local_e1);
  uVar1 = local_c8.member.cap * 2;
  uVar3 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar4 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_50 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_50 = local_c8.member.next % uVar1;
  }
  first_end_00.current = sStack_50;
  first_end_00.parent = &local_c8;
  first_begin_00.current = uVar4;
  first_begin_00.parent = &local_c8;
  local_58 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x635,"void plain_array_suite::expand_front()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_c8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_c8);
  *piVar2 = 0x16;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_c8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_c8);
  *piVar2 = 0x21;
  local_a8[0] = 0;
  local_a8[1] = 0xb;
  local_a8[2] = 0x16;
  local_a8[3] = 0x21;
  __l_01._M_len = 4;
  __l_01._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_01,&local_e1);
  uVar1 = local_c8.member.cap * 2;
  uVar3 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar4 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_60 = local_c8.member.next % uVar1;
  }
  first_end_01.current = sStack_60;
  first_end_01.parent = &local_c8;
  first_begin_01.current = uVar4;
  first_begin_01.parent = &local_c8;
  local_68 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x63c,"void plain_array_suite::expand_front()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_c8,1);
  local_a8[0] = 0x21;
  local_a8[1] = 0;
  local_a8[2] = 0xb;
  local_a8[3] = 0x16;
  __l_02._M_len = 4;
  __l_02._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_02,&local_e1);
  uVar1 = local_c8.member.cap * 2;
  uVar3 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar4 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_70 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_70 = local_c8.member.next % uVar1;
  }
  first_end_02.current = sStack_70;
  first_end_02.parent = &local_c8;
  first_begin_02.current = uVar4;
  first_begin_02.parent = &local_c8;
  local_78 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x642,"void plain_array_suite::expand_front()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_c8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_c8);
  *piVar2 = 0x2c;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_c8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_c8);
  *piVar2 = 0x37;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_c8,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_c8);
  *piVar2 = 0x42;
  local_a8[0] = 0x16;
  local_a8[1] = 0x2c;
  local_a8[2] = 0x37;
  local_a8[3] = 0x42;
  __l_03._M_len = 4;
  __l_03._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_03,&local_e1);
  uVar1 = local_c8.member.cap * 2;
  uVar3 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar4 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_80 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_80 = local_c8.member.next % uVar1;
  }
  first_end_03.current = sStack_80;
  first_end_03.parent = &local_c8;
  first_begin_03.current = uVar4;
  first_begin_03.parent = &local_c8;
  local_88 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x64a,"void plain_array_suite::expand_front()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&local_c8,1);
  local_a8[0] = 0x42;
  local_a8[1] = 0x16;
  local_a8[2] = 0x2c;
  local_a8[3] = 0x37;
  __l_04._M_len = 4;
  __l_04._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_04,&local_e1);
  uVar1 = local_c8.member.cap * 2;
  uVar3 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar4 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_90 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_90 = local_c8.member.next % uVar1;
  }
  first_end_04.current = sStack_90;
  first_end_04.parent = &local_c8;
  first_begin_04.current = uVar4;
  first_begin_04.parent = &local_c8;
  local_98 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x650,"void plain_array_suite::expand_front()",first_begin_04,first_end_04,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_front()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 0, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(22);
    span.push_back(33);
    {
        std::vector<int> expect = { 0, 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 33, 0, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(44);
    span.push_back(55);
    span.push_back(66);
    {
        std::vector<int> expect = { 22, 44, 55, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 66, 22, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}